

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryEntry.h
# Opt level: O2

void __thiscall
JsUtil::
DefaultHashedEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
::Set(DefaultHashedEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      *this,WriteBarrierPtr<void> *key,WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_> *value,
     int hashCode)

{
  Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::operator=
            ((WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_> *)this,value);
  Memory::WriteBarrierPtr<void>::operator=
            (&(this->
              super_KeyValueEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>_>
              ).
              super_ValueEntry<Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>_>_>
              .
              super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>_>
              .key,key);
  return;
}

Assistant:

void Set(TKey const& key, TValue const& value, int hashCode)
        {
            __super::Set(key, value);
        }